

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.h
# Opt level: O2

void __thiscall
haVoc::ScoredMoves::ScoredMoves
          (ScoredMoves *this,position *p,Movegen *m,vector<Move,_std::allocator<Move>_> *filters,
          Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc score_lambda,Score cutoff
          )

{
  function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
  local_50;
  
  (this->m_moves).super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_start = 0;
  this->m_end = 0;
  (this->m_moves).super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_moves).super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
  ::function(&local_50,
             (function<Score_(const_position_&,_const_Move_&,_const_Move_&,_const_Move_&,_const_Move_&,_node_*)>
              *)score_lambda.super__Function_base._M_functor._M_unused._0_8_);
  load_and_score(this,p,m,filters,previous,followup,threat,stack,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  sort(this,(Score *)(score_lambda.super__Function_base._M_functor._M_pod_data + 8));
  return;
}

Assistant:

ScoredMoves(const position& p, Movegen* m, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda, Score cutoff) {
			m_moves.clear();
			load_and_score(p, m, filters, previous, followup, threat, stack, score_lambda);
			sort(cutoff);
		}